

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::lowerReinterpretFloat64(I64ToI32Lowering *this,Unary *curr)

{
  Builder *pBVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  char *pcVar4;
  Call *pCVar5;
  LocalSet *append;
  Block *e;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  initializer_list<wasm::Expression_*> __l_00;
  Name target_00;
  initializer_list<wasm::Expression_*> __l_01;
  Name target_01;
  Expression *local_d0;
  Const *local_c8;
  Const *local_c0;
  undefined1 local_b8 [8];
  TempVar highBits;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_80;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  Builder *local_50;
  Builder *local_48;
  Call *local_40;
  Index local_38;
  allocator_type local_33;
  allocator_type local_32;
  allocator_type local_31;
  
  getTemp((TempVar *)local_b8,this,(Type)0x2);
  pcVar4 = DAT_01174f08;
  sVar3 = ABI::wasm2js::SCRATCH_STORE_F64;
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_d0 = curr->value;
  __l._M_len = 1;
  __l._M_array = &local_d0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&highBits.ty,__l,
             &local_33);
  target.super_IString.str._M_str = pcVar4;
  target.super_IString.str._M_len = sVar3;
  local_48 = pBVar1;
  local_40 = Builder::makeCall(pBVar1,target,
                               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                               &highBits.ty,(Type)0x0,false);
  local_50 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_38 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_b8);
  pcVar4 = DAT_01174eb8;
  sVar3 = ABI::wasm2js::SCRATCH_LOAD_I32;
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_c8 = Builder::makeConst<int>(pBVar1,1);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_c8;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_80,__l_00,
             &local_32);
  target_00.super_IString.str._M_str = pcVar4;
  target_00.super_IString.str._M_len = sVar3;
  pCVar5 = Builder::makeCall(pBVar1,target_00,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_80,(Type)0x2,false);
  append = Builder::makeLocalSet(local_50,local_38,(Expression *)pCVar5);
  pcVar4 = DAT_01174eb8;
  sVar3 = ABI::wasm2js::SCRATCH_LOAD_I32;
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_c0 = Builder::makeConst<int>(pBVar1,0);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_c0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_68,__l_01,
             &local_31);
  target_01.super_IString.str._M_str = pcVar4;
  target_01.super_IString.str._M_len = sVar3;
  pCVar5 = Builder::makeCall(pBVar1,target_01,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &local_68,(Type)0x2,false);
  e = Builder::blockify<wasm::Call*>(local_48,(Expression *)local_40,(Expression *)append,pCVar5);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_68);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&local_80);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&highBits.ty);
  setOutParam(this,(Expression *)e,(TempVar *)local_b8);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)e);
  MemoryUtils::ensureExists
            ((this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = pCVar5;
  ABI::wasm2js::ensureHelpers
            ((wasm2js *)
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
             ).
             super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>.
             currModule,(Module *)0x0,(IString)(auVar2 << 0x40));
  TempVar::~TempVar((TempVar *)local_b8);
  return;
}

Assistant:

void lowerReinterpretFloat64(Unary* curr) {
    // Assume that the wasm file assumes the address 0 is invalid and roundtrip
    // our f64 through memory at address 0
    TempVar highBits = getTemp();
    Block* result = builder->blockify(
      builder->makeCall(
        ABI::wasm2js::SCRATCH_STORE_F64, {curr->value}, Type::none),
      builder->makeLocalSet(highBits,
                            builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_I32,
                                              {builder->makeConst(int32_t(1))},
                                              Type::i32)),
      builder->makeCall(ABI::wasm2js::SCRATCH_LOAD_I32,
                        {builder->makeConst(int32_t(0))},
                        Type::i32));
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
    MemoryUtils::ensureExists(getModule());
    ABI::wasm2js::ensureHelpers(getModule());
  }